

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_hmi.cpp
# Opt level: O1

bool midi_processor::process_hmi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  const_iterator cVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  event_type p_type;
  size_type __new_size;
  unsigned_long uVar10;
  unsigned_long p_timestamp;
  byte bVar11;
  uint uVar12;
  unsigned_long p_timestamp_00;
  size_t p_data_count;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  pointer puVar17;
  const_iterator cVar18;
  ulong uVar19;
  unsigned_long uVar20;
  bool bVar21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_track track;
  vector<unsigned_int,_std::allocator<unsigned_int>_> track_offsets;
  const_iterator local_108;
  uint local_100;
  byte local_f9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  int local_dc;
  midi_track local_d8;
  midi_container *local_b8;
  midi_event local_b0;
  uint local_70;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  size_t local_48;
  ulong local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar17 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_108._M_current = puVar17 + 0xe4;
  uVar16 = *(uint *)(puVar17 + 0xe8);
  uVar9 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar17;
  local_b8 = p_out;
  if (uVar16 < uVar9) {
    bVar11 = (byte)*(ushort *)(puVar17 + 0xe4);
    bVar4 = puVar17[0xe5];
    uVar6 = *(ushort *)(puVar17 + 0xe4);
    bVar5 = puVar17[0xe6];
    uVar12 = (uint)((ulong)bVar5 << 0x10);
    uVar15 = (uint)puVar17[0xe7] << 0x18;
    uVar13 = (uint)bVar4 * 0x100 + (uint)bVar11 | uVar12 | uVar15;
    if (uVar16 + uVar13 * 4 <= uVar9) {
      local_108._M_current = puVar17 + uVar16;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_68,(ulong)uVar13);
      cVar18._M_current = local_108._M_current;
      if (uVar13 != 0) {
        uVar9 = 0;
        do {
          lVar3 = uVar9 * 4;
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = *(uint *)(local_108._M_current + lVar3);
          uVar9 = uVar9 + 1;
          cVar18._M_current = (uchar *)((long)(local_108._M_current + lVar3) + 4);
        } while (((uint)uVar6 | uVar15 | uVar12) != uVar9);
      }
      local_108._M_current = cVar18._M_current;
      midi_container::initialize(local_b8,1,0xc0);
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      midi_event::midi_event(&local_b0,0,extended,0,hmp_default_tempo,5);
      midi_track::add_event(&local_d8,&local_b0);
      if (local_b0.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.m_ext_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      midi_event::midi_event(&local_b0,0,extended,0,end_of_track,2);
      midi_track::add_event(&local_d8,&local_b0);
      if (local_b0.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.m_ext_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      midi_container::add_track(local_b8,&local_d8);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
      uVar9 = CONCAT71((int7)(((ulong)bVar5 << 0x10) >> 8),uVar13 == 0);
      uVar16 = uVar15 | uVar12 | (uint)bVar4 * 0x100 | (uint)bVar11;
      if (uVar16 != 0) {
        uVar19 = 0;
        uVar14 = (ulong)uVar13;
        local_70 = uVar16;
        do {
          local_100 = (uint)uVar9;
          uVar9 = (ulong)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar19];
          local_6c = (int)uVar19 + 1;
          if (local_6c < (uint)uVar14) {
            uVar19 = (ulong)(local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[local_6c] -
                            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar19]);
          }
          else {
            uVar19 = (long)(p_file->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)((p_file->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar9);
          }
          puVar17 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar8 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar17;
          if ((((((uVar8 <= uVar9) || (uVar8 < uVar19 + uVar9)) || (uVar19 < 0xd)) ||
               ((puVar17 = puVar17 + uVar9, *puVar17 != 'H' || (puVar17[1] != 'M')))) ||
              (((puVar17[2] != 'I' || ((puVar17[3] != '-' || (puVar17[4] != 'M')))) ||
               (puVar17[5] != 'I')))) ||
             ((((puVar17[6] != 'D' || (puVar17[7] != 'I')) || (puVar17[8] != 'T')) ||
              (((puVar17[9] != 'R' || (puVar17[10] != 'A')) ||
               ((puVar17[0xb] != 'C' || (puVar17[0xc] != 'K')))))))) {
LAB_0010cc2e:
            uVar9 = (ulong)local_100;
            break;
          }
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_40 = uVar14;
          local_38 = p_file;
          if (uVar19 < 0x4f) {
LAB_0010cc24:
            std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
            goto LAB_0010cc2e;
          }
          uVar16 = *(uint *)(puVar17 + 0x4b);
          uVar9 = (ulong)uVar16;
          if ((uVar9 != 0) && (uVar16 + 1 < uVar19)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,2);
            *(undefined2 *)
             local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = *(undefined2 *)(puVar17 + uVar9);
            bVar11 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1];
            if (uVar19 < uVar16 + bVar11 + 2) goto LAB_0010cc24;
            __new_size = (ulong)bVar11 + 2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,__new_size)
            ;
            if (bVar11 != 0) {
              memmove(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 2,puVar17 + uVar9 + 2,(ulong)bVar11
                     );
              do {
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[__new_size - 1] != 0x20) {
                  *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = 0xff;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = 1;
                  midi_event::midi_event
                            (&local_b0,0,extended,0,
                             local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,__new_size & 0xffffffff);
                  midi_track::add_event(&local_d8,&local_b0);
                  if (local_b0.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b0.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  break;
                }
                __new_size = __new_size - 1;
              } while (__new_size != 2);
            }
          }
          if (uVar19 < 0x5b) goto LAB_0010cc24;
          local_108._M_current = puVar17 + *(uint *)(puVar17 + 0x57);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,3);
          cVar18._M_current = puVar17 + uVar19;
          bVar11 = 0xff;
          uVar10 = 0;
          p_timestamp = 0;
          do {
            if (local_108._M_current == cVar18._M_current) goto LAB_0010cbda;
            uVar16 = decode_delta(&local_108,cVar18);
            uVar12 = (int)p_timestamp + uVar16;
            uVar20 = uVar10;
            if ((uint)uVar10 < uVar12) {
              uVar20 = (unsigned_long)uVar12;
            }
            if (0xffff < uVar16) {
              uVar20 = uVar10;
            }
            p_timestamp_00 = (ulong)uVar12;
            if (0xffff < uVar16) {
              p_timestamp_00 = uVar10;
            }
            local_dc = 1;
            p_timestamp = p_timestamp_00;
            uVar10 = uVar20;
            cVar1._M_current = local_108._M_current;
            if (local_108._M_current != cVar18._M_current) {
              cVar1._M_current = local_108._M_current + 1;
              *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = *local_108._M_current;
              bVar4 = *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (bVar4 == 0xf0) {
                local_108._M_current = cVar1._M_current;
                uVar16 = decode_delta(&local_108,cVar18);
                bVar11 = 0xff;
                cVar1._M_current = local_108._M_current;
                if (-1 < (int)uVar16) {
                  uVar9 = (ulong)uVar16;
                  if ((long)uVar9 <= (long)cVar18._M_current - (long)local_108._M_current) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_f8,(ulong)(uVar16 + 1));
                    if (uVar16 != 0) {
                      memmove(local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1,local_108._M_current,
                              uVar9);
                    }
                    local_108._M_current = local_108._M_current + uVar9;
                    midi_event::midi_event
                              (&local_b0,p_timestamp_00,extended,0,
                               local_f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,(ulong)(uVar16 + 1));
                    midi_track::add_event(&local_d8,&local_b0);
                    goto LAB_0010c8bd;
                  }
LAB_0010c830:
                  local_108._M_current = cVar1._M_current;
                  bVar11 = 0xff;
                  cVar1._M_current = local_108._M_current;
                }
              }
              else if (bVar4 == 0xfe) {
                bVar11 = 0xff;
                if (cVar1._M_current != cVar18._M_current) {
                  pbVar2 = local_108._M_current + 2;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = *cVar1._M_current;
                  cVar1._M_current = pbVar2;
                  switch(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[1]) {
                  case '\x10':
                    if (2 < (long)cVar18._M_current - (long)pbVar2) {
                      cVar1._M_current = local_108._M_current + 5;
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[2] = local_108._M_current[4];
                      if ((long)((ulong)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[2] + 4) <=
                          (long)cVar18._M_current - (long)cVar1._M_current) {
                        local_108._M_current =
                             cVar1._M_current +
                             (ulong)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[2] + 4;
                        goto LAB_0010cb1b;
                      }
                    }
                    break;
                  case '\x12':
                    if (1 < (long)cVar18._M_current - (long)pbVar2) {
                      local_108._M_current = local_108._M_current + 4;
                      goto LAB_0010cb1b;
                    }
                    break;
                  case '\x13':
                    if (9 < (long)cVar18._M_current - (long)pbVar2) {
                      local_108._M_current = local_108._M_current + 0xc;
                      goto LAB_0010cb1b;
                    }
                    break;
                  case '\x14':
                    if (1 < (long)cVar18._M_current - (long)pbVar2) {
                      local_108._M_current = local_108._M_current + 4;
                      midi_event::midi_event(&local_b0,p_timestamp_00,extended,0,loop_start,0xb);
                      midi_container::add_track_event(local_b8,0,&local_b0);
LAB_0010c8bd:
                      if (local_b0.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_b0.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_b0.m_ext_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_b0.m_ext_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      bVar11 = 0xff;
                      goto LAB_0010cb1b;
                    }
                    break;
                  case '\x15':
                    if (5 < (long)cVar18._M_current - (long)pbVar2) {
                      local_108._M_current = local_108._M_current + 8;
                      midi_event::midi_event(&local_b0,p_timestamp_00,extended,0,loop_end,9);
                      midi_container::add_track_event(local_b8,0,&local_b0);
                      goto LAB_0010c8bd;
                    }
                  }
                }
              }
              else if (bVar4 == 0xff) {
                if (cVar1._M_current == cVar18._M_current) goto LAB_0010c830;
                local_108._M_current = local_108._M_current + 2;
                local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1] = *cVar1._M_current;
                uVar16 = decode_delta(&local_108,cVar18);
                local_dc = 1;
                if (((int)uVar16 < 0) ||
                   (uVar9 = (ulong)uVar16,
                   (long)cVar18._M_current - (long)local_108._M_current < (long)uVar9)) {
                  bVar21 = false;
                }
                else {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_f8,(ulong)(uVar16 + 2));
                  if (uVar16 != 0) {
                    memmove(local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 2,local_108._M_current,uVar9)
                    ;
                  }
                  local_108._M_current = local_108._M_current + uVar9;
                  if ((uint)p_timestamp_00 < (uint)uVar20) {
                    p_timestamp = uVar20;
                  }
                  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[1] != 0x2f) {
                    p_timestamp = p_timestamp_00;
                  }
                  midi_event::midi_event
                            (&local_b0,p_timestamp,extended,0,
                             local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(ulong)(uVar16 + 2));
                  midi_track::add_event(&local_d8,&local_b0);
                  if (local_b0.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b0.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  bVar21 = local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[1] != 0x2f;
                  local_dc = 0xb;
                  if (bVar21) {
                    local_dc = 0;
                  }
                }
                bVar11 = 0xff;
                p_timestamp_00 = p_timestamp;
                cVar1._M_current = local_108._M_current;
                if (bVar21) goto LAB_0010cb1b;
              }
              else if (bVar4 < 0xf0) {
                local_f9 = bVar11;
                if ((char)bVar4 < '\0') {
                  if (cVar1._M_current != cVar18._M_current) {
                    local_108._M_current = local_108._M_current + 2;
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[1] = *cVar1._M_current;
                    bVar11 = *local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    goto LAB_0010c9bd;
                  }
LAB_0010cade:
                  local_108._M_current = cVar1._M_current;
                  bVar21 = false;
                }
                else {
                  if (bVar11 == 0xff) goto LAB_0010cade;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = bVar4;
                  *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar11;
                  local_108._M_current = cVar1._M_current;
LAB_0010c9bd:
                  uVar16 = (uint)(*local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
                  p_data_count = 1;
                  local_f9 = bVar11;
                  if (uVar16 - 0xe < 0xfffffffe) {
                    cVar1._M_current = local_108._M_current;
                    if (local_108._M_current == cVar18._M_current) goto LAB_0010cade;
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[2] = *local_108._M_current;
                    p_data_count = 2;
                    local_108._M_current = local_108._M_current + 1;
                  }
                  p_type = uVar16 + ~extended;
                  uVar16 = *local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xf;
                  local_48 = p_data_count;
                  midi_event::midi_event
                            (&local_b0,p_timestamp_00,p_type,uVar16,
                             local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1,p_data_count);
                  midi_track::add_event(&local_d8,&local_b0);
                  if (local_b0.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b0.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b0.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  bVar21 = true;
                  if (p_type == note_on) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[2] = 0;
                    iVar7 = decode_delta(&local_108,cVar18);
                    bVar21 = -1 < iVar7;
                    if (bVar21) {
                      uVar12 = iVar7 + (uint)p_timestamp_00;
                      if ((uint)uVar20 < uVar12) {
                        uVar20 = (unsigned_long)uVar12;
                      }
                      midi_event::midi_event
                                (&local_b0,(ulong)uVar12,note_on,uVar16,
                                 local_f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1,local_48);
                      midi_track::add_event(&local_d8,&local_b0);
                      if (local_b0.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_b0.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_b0.m_ext_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_b0.m_ext_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                  }
                }
                uVar10 = uVar20;
                bVar11 = local_f9;
                cVar1._M_current = local_108._M_current;
                if (bVar21) {
LAB_0010cb1b:
                  local_dc = 0;
                  p_timestamp = p_timestamp_00;
                  uVar10 = uVar20;
                  cVar1._M_current = local_108._M_current;
                }
              }
            }
            local_108._M_current = cVar1._M_current;
          } while (local_dc == 0);
          if (local_dc != 0xb) goto LAB_0010cc24;
LAB_0010cbda:
          midi_container::add_track(local_b8,&local_d8);
          std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
          uVar19 = (ulong)local_6c;
          uVar9 = CONCAT71((int7)(p_timestamp >> 8),(uint)local_40 <= local_6c);
          uVar14 = local_40;
          p_file = local_38;
        } while (local_6c != local_70);
      }
      bVar11 = (byte)uVar9;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0010c2f1;
    }
  }
  bVar11 = 0;
LAB_0010c2f1:
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool midi_processor::process_hmi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    std::vector<uint8_t> buffer;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 0xE4;

    uint32_t track_count        = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
    uint32_t track_table_offset = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );

    if ( track_table_offset >= p_file.size() || track_table_offset + track_count * 4 > p_file.size() )
        return false;

    it = p_file.begin() + track_table_offset;

    std::vector<uint32_t> track_offsets;
    track_offsets.resize( track_count );

    for ( unsigned i = 0; i < track_count; ++i )
    {
        track_offsets[ i ] = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
        it += 4;
    }

    p_out.initialize( 1, 0xC0 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, hmp_default_tempo, _countof( hmp_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    for ( unsigned i = 0; i < track_count; ++i )
    {
        unsigned track_offset = track_offsets[ i ];
        unsigned long track_length;
        if ( i + 1 < track_count )
        {
            track_length = track_offsets[ i + 1 ] - track_offset;
        }
        else
        {
            track_length = p_file.size() - track_offset;
        }
        if ( track_offset >= p_file.size() || track_offset + track_length > p_file.size() )
            return false;

        std::vector<uint8_t>::const_iterator track_body = p_file.begin() + track_offset;
        std::vector<uint8_t>::const_iterator track_end = track_body + track_length;

        if ( track_length < 13 ) return false;
        if ( track_body[ 0 ] != 'H' || track_body[ 1 ] != 'M' || track_body[ 2 ] != 'I' || track_body[ 3 ] != '-' ||
             track_body[ 4 ] != 'M' || track_body[ 5 ] != 'I' || track_body[ 6 ] != 'D' || track_body[ 7 ] != 'I' ||
             track_body[ 8 ] != 'T' || track_body[ 9 ] != 'R' || track_body[ 10 ] != 'A' || track_body[ 11 ] != 'C' ||
             track_body[ 12 ] != 'K' ) return false;

        midi_track track;
        unsigned current_timestamp = 0;
        unsigned char last_event_code = 0xFF;

        unsigned last_event_timestamp = 0;

        if ( track_length < 0x4B + 4 ) return false;

        uint32_t meta_offset = track_body[ 0x4B ] | ( track_body[ 0x4C ] << 8 ) | ( track_body[ 0x4D ] << 16 ) | ( track_body[ 0x4E ] << 24 );
        if ( meta_offset && meta_offset + 1 < track_length )
        {
            buffer.resize( 2 );
            std::copy( track_body + meta_offset, track_body + meta_offset + 2, buffer.begin() );
            unsigned meta_size = buffer[ 1 ];
            if ( meta_offset + 2 + meta_size > track_length ) return false;
            buffer.resize( meta_size + 2 );
            std::copy( track_body + meta_offset + 2, track_body + meta_offset + 2 + meta_size, buffer.begin() + 2 );
            while ( meta_size > 0 && buffer[ meta_size + 1 ] == ' ' ) --meta_size;
            if ( meta_size > 0 )
            {
                buffer[ 0 ] = 0xFF;
                buffer[ 1 ] = 0x01;
                track.add_event( midi_event( 0, midi_event::extended, 0, &buffer[0], meta_size + 2 ) );
            }
        }

        if ( track_length < 0x57 + 4 ) return false;

        uint32_t track_data_offset = track_body[ 0x57 ] | ( track_body[ 0x58 ] << 8 ) | ( track_body[ 0x59 ] << 16 ) | ( track_body[ 0x5A ] << 24 );

        it = track_body + track_data_offset;

        buffer.resize( 3 );

        while ( it != track_end )
        {
            int delta = decode_delta( it, track_end );
            if ( delta > 0xFFFF || delta < 0 )
            {
                current_timestamp = last_event_timestamp;
                /*console::formatter() << "[foo_midi] Large HMI delta detected, shunting.";*/
            }
            else
            {
                current_timestamp += delta;
                if ( current_timestamp > last_event_timestamp )
                {
                    last_event_timestamp = current_timestamp;
                }
            }

            if ( it == track_end ) return false;
            buffer[ 0 ] = *it++;
            if ( buffer[ 0 ] == 0xFF )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                int meta_count = decode_delta( it, track_end );
                if ( meta_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI meta message" );*/
                if ( track_end - it < meta_count ) return false;
                buffer.resize( meta_count + 2 );
                std::copy( it, it + meta_count, buffer.begin() + 2 );
                it += meta_count;
                if ( buffer[ 1 ] == 0x2F && last_event_timestamp > current_timestamp )
                {
                    current_timestamp = last_event_timestamp;
                }
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], meta_count + 2 ) );
                if ( buffer[ 1 ] == 0x2F ) break;
            }
            else if ( buffer[ 0 ] == 0xF0 )
            {
                last_event_code = 0xFF;
                int system_exclusive_count = decode_delta( it, track_end );
                if ( system_exclusive_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI System Exclusive message" );*/
                if ( track_end - it < system_exclusive_count ) return false;
                buffer.resize( system_exclusive_count + 1 );
                std::copy( it, it + system_exclusive_count, buffer.begin() + 1 );
                it += system_exclusive_count;
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], system_exclusive_count + 1 ) );
            }
            else if ( buffer[ 0 ] == 0xFE )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                if ( buffer[ 1 ] == 0x10 )
                {
                    if ( track_end - it < 3 ) return false;
                    it += 2;
                    buffer[ 2 ] = *it++;
                    if ( track_end - it < buffer[ 2 ] + 4 ) return false;
                    it += buffer[ 2 ] + 4;
                }
                else if ( buffer[ 1 ] == 0x12 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                }
                else if ( buffer[ 1 ] == 0x13 )
                {
                    if ( track_end - it < 10 ) return false;
                    it += 10;
                }
                else if ( buffer[ 1 ] == 0x14 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_start, _countof( loop_start ) ) );
                }
                else if ( buffer[ 1 ] == 0x15 )
                {
                    if ( track_end - it < 6 ) return false;
                    it += 6;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_end, _countof( loop_end ) ) );
                }
                else return false; /*throw exception_io_data( "Unexpected HMI meta event" );*/
            }
            else if ( buffer[ 0 ] <= 0xEF )
            {
                unsigned bytes_read = 1;
                if ( buffer[ 0 ] >= 0x80 )
                {
                    if ( it == track_end ) return false;
                    buffer[ 1 ] = *it++;
                    last_event_code = buffer[ 0 ];
                }
                else
                {
                    if ( last_event_code == 0xFF ) return false; /*throw exception_io_data( "HMI used shortened event after Meta or SysEx message" );*/
                    buffer[ 1 ] = buffer[ 0 ];
                    buffer[ 0 ] = last_event_code;
                }
                midi_event::event_type type = (midi_event::event_type)( ( buffer[ 0 ] >> 4 ) - 8 );
                unsigned channel = buffer[ 0 ] & 0x0F;
                if ( type != midi_event::program_change && type != midi_event::channel_aftertouch )
                {
                    if ( it == track_end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_read = 2;
                }
                track.add_event( midi_event( current_timestamp, type, channel, &buffer[ 1 ], bytes_read ) );
                if ( type == midi_event::note_on )
                {
                    buffer[ 2 ] = 0x00;
                    int note_length = decode_delta( it, track_end );
                    if ( note_length < 0 ) return false; /*throw exception_io_data( "Invalid HMI note message" );*/
                    unsigned note_end_timestamp = current_timestamp + note_length;
                    if ( note_end_timestamp > last_event_timestamp ) last_event_timestamp = note_end_timestamp;
                    track.add_event( midi_event( note_end_timestamp, midi_event::note_on, channel, &buffer[1], bytes_read ) );
                }
            }
            else return false; /*throw exception_io_data( "Unexpected HMI status code" );*/
        }

        p_out.add_track( track );
    }

    return true;
}